

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSON * __thiscall phosg::JSON::at(JSON *this,size_t index)

{
  list_type *this_00;
  size_type sVar1;
  out_of_range *this_01;
  reference this_02;
  type pJVar2;
  list_type *list;
  size_t index_local;
  JSON *this_local;
  
  this_00 = as_list(this);
  sVar1 = ::std::
          vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
          ::size(this_00);
  if (sVar1 <= index) {
    this_01 = (out_of_range *)__cxa_allocate_exception(0x10);
    ::std::out_of_range::out_of_range(this_01,"JSON array index out of bounds");
    __cxa_throw(this_01,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
  }
  this_02 = ::std::
            vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
            ::operator[](this_00,index);
  pJVar2 = ::std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>::operator*(this_02);
  return pJVar2;
}

Assistant:

JSON& JSON::at(size_t index) {
  auto& list = this->as_list();
  if (index >= list.size()) {
    throw out_of_range("JSON array index out of bounds");
  }
  return *list[index];
}